

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O2

ssize_t __thiscall serial::Serial::read(Serial *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  ScopedReadLock lock;
  ScopedReadLock local_20;
  
  local_20.pimpl_ = this->pimpl_;
  SerialImpl::readLock(local_20.pimpl_);
  sVar1 = SerialImpl::read(this->pimpl_,__fd,__buf,__nbytes);
  ScopedReadLock::~ScopedReadLock(&local_20);
  return sVar1;
}

Assistant:

size_t
Serial::read (uint8_t *buffer, size_t size)
{
  ScopedReadLock lock(this->pimpl_);
  return this->pimpl_->read (buffer, size);
}